

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemcontext.h
# Opt level: O2

void __thiscall
cookmem::MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::~MemContext
          (MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this)

{
  this->_vptr_MemContext = (_func_int **)&PTR__MemContext_00104da0;
  MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::~MemPool(&this->m_pool);
  return;
}

Assistant:

virtual ~MemContext()
    {
    }